

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NurbsSurfaceGeometry.h
# Opt level: O2

void __thiscall
anurbs::NurbsSurfaceGeometry<2L>::NurbsSurfaceGeometry
          (NurbsSurfaceGeometry<2L> *this,Index degree_u,Index degree_v,VectorXd *knots_u,
          VectorXd *knots_v,
          vector<std::pair<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_double>,_std::allocator<std::pair<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_double>_>_>
          *control_points)

{
  Scalar SVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  pointer ppVar4;
  Scalar *pSVar5;
  runtime_error *this_00;
  Index i;
  long lVar6;
  pointer ppVar7;
  long lVar8;
  long local_68;
  Block<Eigen::Matrix<double,__1,_2,_1,__1,_2>,_1,_2,_true> local_60;
  
  (this->super_SurfaceBase<2L>)._vptr_SurfaceBase =
       (_func_int **)&PTR__NurbsSurfaceGeometry_0038c728;
  this->m_degree_u = degree_u;
  this->m_degree_v = degree_v;
  this->m_nb_poles_u =
       ((knots_u->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows -
       degree_u) + 1;
  this->m_nb_poles_v =
       ((knots_v->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows -
       degree_v) + 1;
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,_1,_0> *)&this->m_knots_u,
             (DenseStorage<double,__1,__1,_1,_0> *)knots_u);
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,_1,_0> *)&this->m_knots_v,
             (DenseStorage<double,__1,__1,_1,_0> *)knots_v);
  local_60.super_BlockImpl<Eigen::Matrix<double,__1,_2,_1,__1,_2>,_1,_2,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,_2,_1,__1,_2>,_1,_2,_true,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_2,_1,__1,_2>,_1,_2,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_2,_1,__1,_2>,_1,_2,_true>,_0>.m_data =
       (PointerType)
       ((long)(control_points->
              super__Vector_base<std::pair<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_double>,_std::allocator<std::pair<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_double>_>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(control_points->
              super__Vector_base<std::pair<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_double>,_std::allocator<std::pair<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_double>_>_>
              )._M_impl.super__Vector_impl_data._M_start >> 5);
  local_68 = 2;
  Eigen::Matrix<double,-1,2,1,-1,2>::Matrix<long,long>
            ((Matrix<double,_1,2,1,_1,2> *)&this->m_poles,(long *)&local_60,&local_68);
  local_60.super_BlockImpl<Eigen::Matrix<double,__1,_2,_1,__1,_2>,_1,_2,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,_2,_1,__1,_2>,_1,_2,_true,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_2,_1,__1,_2>,_1,_2,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_2,_1,__1,_2>,_1,_2,_true>,_0>.m_data =
       (PointerType)
       ((long)(control_points->
              super__Vector_base<std::pair<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_double>,_std::allocator<std::pair<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_double>_>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(control_points->
              super__Vector_base<std::pair<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_double>,_std::allocator<std::pair<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_double>_>_>
              )._M_impl.super__Vector_impl_data._M_start >> 5);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<long>(&this->m_weights,(long *)&local_60);
  lVar6 = (this->m_knots_u).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
          .m_rows;
  iVar2 = (*(this->super_SurfaceBase<2L>)._vptr_SurfaceBase[2])(this);
  lVar8 = (this->m_knots_v).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
          .m_rows;
  iVar3 = (*(this->super_SurfaceBase<2L>)._vptr_SurfaceBase[3])(this);
  ppVar7 = (control_points->
           super__Vector_base<std::pair<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_double>,_std::allocator<std::pair<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_double>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  ppVar4 = (control_points->
           super__Vector_base<std::pair<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_double>,_std::allocator<std::pair<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_double>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (((lVar8 - CONCAT44(extraout_var_00,iVar3)) + 1) * ((lVar6 - CONCAT44(extraout_var,iVar2)) + 1)
      - ((long)ppVar4 - (long)ppVar7 >> 5) == 0) {
    lVar8 = 0;
    for (lVar6 = 0; lVar6 < (long)ppVar4 - (long)ppVar7 >> 5; lVar6 = lVar6 + 1) {
      Eigen::Block<Eigen::Matrix<double,_-1,_2,_1,_-1,_2>,_1,_2,_true>::Block
                (&local_60,&this->m_poles,lVar6);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,2,1,_1,2>,1,2,true>,Eigen::Matrix<double,1,2,1,1,2>>
                (&local_60,
                 (Matrix<double,_1,_2,_1,_1,_2> *)
                 ((long)(ppVar7->first).super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
                        .m_storage.m_data.array + lVar8));
      SVar1 = *(Scalar *)
               ((long)(&((control_points->
                         super__Vector_base<std::pair<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_double>,_std::allocator<std::pair<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_double>_>_>
                         )._M_impl.super__Vector_impl_data._M_start)->first + 1) + lVar8);
      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                          &this->m_weights,lVar6);
      *pSVar5 = SVar1;
      ppVar7 = (control_points->
               super__Vector_base<std::pair<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_double>,_std::allocator<std::pair<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_double>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      ppVar4 = (control_points->
               super__Vector_base<std::pair<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_double>,_std::allocator<std::pair<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_double>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      lVar8 = lVar8 + 0x20;
    }
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Number of knots and control points do not match");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

NurbsSurfaceGeometry(
        const Index degree_u,
        const Index degree_v,
        const Eigen::VectorXd& knots_u,
        const Eigen::VectorXd& knots_v,
        const std::vector<ControlPoint>& control_points)
        : m_degree_u(degree_u)
        , m_degree_v(degree_v)
        , m_nb_poles_u(Nurbs::nb_poles(degree_u, length(knots_u)))
        , m_nb_poles_v(Nurbs::nb_poles(degree_v, length(knots_v)))
        , m_knots_u(knots_u)
        , m_knots_v(knots_v)
        , m_poles(length(control_points), TDimension)
        , m_weights(length(control_points))
    {
        static_assert(TDimension > 0);

        if (nb_poles_u() * nb_poles_v() != length(control_points)) {
            throw std::runtime_error("Number of knots and control points do not match");
        }

        for (Index i = 0; i < length(control_points); i++) {
            m_poles.row(i) = std::get<0>(control_points[i]);
            m_weights[i] = std::get<1>(control_points[i]);
        }
    }